

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigNumber.cpp
# Opt level: O0

bool operator>(BigNumber *value1,BigNumber *value2)

{
  value_type vVar1;
  uint uVar2;
  uint uVar3;
  reference pvVar4;
  uint local_24;
  int i;
  BigNumber *value2_local;
  BigNumber *value1_local;
  
  BigNumber::m_format(value1);
  BigNumber::m_format(value2);
  uVar2 = Polynome::m_degre(&value1->super_Polynome);
  uVar3 = Polynome::m_degre(&value2->super_Polynome);
  if (uVar3 < uVar2) {
    value1_local._7_1_ = true;
  }
  else {
    uVar2 = Polynome::m_degre(&value1->super_Polynome);
    uVar3 = Polynome::m_degre(&value2->super_Polynome);
    if (uVar2 == uVar3) {
      local_24 = Polynome::m_degre(&value1->super_Polynome);
      do {
        local_24 = local_24 - 1;
        if ((int)local_24 < 0) goto LAB_00104a11;
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)value1,
                            (long)(int)local_24);
        uVar2 = *pvVar4;
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)value2,
                            (long)(int)local_24);
        if (*pvVar4 < uVar2) {
          return true;
        }
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)value1,
                            (long)(int)local_24);
        vVar1 = *pvVar4;
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)value2,
                            (long)(int)local_24);
      } while (vVar1 == *pvVar4);
      value1_local._7_1_ = false;
    }
    else {
LAB_00104a11:
      value1_local._7_1_ = false;
    }
  }
  return value1_local._7_1_;
}

Assistant:

bool operator > (BigNumber& value1, BigNumber& value2){
    value1.m_format();
    value2.m_format();
    if(value1.m_degre() > value2.m_degre()){
        return true;
    }

    else if(value1.m_degre() == value2.m_degre()){
        for(int i = (int) value1.m_degre() - 1; i >= 0; i--){
            if(value1.m_coef[i] > value2.m_coef[i]){
                return true;
            }
            else if(value1.m_coef[i] != value2.m_coef[i]){
                return false;
            }
        }
    }
    return false;

}